

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  type_info *tp;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  size_type sVar6;
  type_info *ptVar7;
  PyMethodDef *pPVar8;
  _func_void_void_ptr *destructor;
  PyObject **ppPVar9;
  PyObject *pPVar10;
  size_t sVar11;
  PyObject *pPVar12;
  size_t sVar13;
  PyTypeObject *local_4b8;
  byte local_481;
  char *local_458;
  PyCFunctionObject *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  handle local_400;
  function_record *it;
  string local_3f0 [3];
  bool first_user_def;
  int index;
  string signatures;
  allocator local_3c9;
  string local_3c8 [32];
  str_attr_accessor local_3a8;
  object local_388;
  str local_380;
  str local_378 [4];
  allocator local_351;
  string local_350 [32];
  char local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  str_attr_accessor local_270;
  object local_250;
  PyObject *local_248;
  str_attr_accessor local_240;
  object local_220;
  PyObject *local_218;
  handle local_210;
  object scope_module;
  handle local_200;
  capsule rec_capsule_1;
  string local_1f0 [32];
  char local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  handle local_190;
  capsule local_188;
  capsule rec_capsule;
  function_record *chain_start;
  function_record *chain;
  allocator local_161;
  string local_160 [8];
  string tname;
  type_info *tinfo;
  type_info *t;
  string local_110 [39];
  char local_e9;
  ulong uStack_e8;
  char c;
  size_t arg_index;
  size_t type_index;
  size_t char_index;
  size_t type_depth;
  string signature;
  str_attr_accessor local_98;
  object local_78;
  object local_70 [4];
  reference local_50;
  argument_record *a;
  iterator __end2;
  iterator __begin2;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range2;
  size_t args_local;
  type_info **types_local;
  char *text_local;
  function_record *rec_local;
  cpp_function *this_local;
  
  if (rec->name == (char *)0x0) {
    local_458 = "";
  }
  else {
    local_458 = rec->name;
  }
  pcVar4 = strdup(local_458);
  rec->name = pcVar4;
  if (rec->doc != (char *)0x0) {
    pcVar4 = strdup(rec->doc);
    rec->doc = pcVar4;
  }
  __end2 = std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin(&rec->args);
  a = (argument_record *)
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::end(&rec->args);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                     *)&a), bVar2) {
    local_50 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end2);
    if (*(long *)local_50 != 0) {
      pcVar4 = strdup(*(char **)local_50);
      *(char **)local_50 = pcVar4;
    }
    if (*(long *)(local_50 + 8) == 0) {
      bVar2 = handle::operator_cast_to_bool((handle *)(local_50 + 0x10));
      if (bVar2) {
        detail::object_api<pybind11::handle>::attr
                  (&local_98,(object_api<pybind11::handle> *)(local_50 + 0x10),"__repr__");
        detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                    *)&local_78);
        object::cast<std::__cxx11::string>(local_70);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pcVar4 = strdup(pcVar4);
        *(char **)(local_50 + 8) = pcVar4;
        std::__cxx11::string::~string((string *)local_70);
        object::~object(&local_78);
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_98);
      }
    }
    else {
      pcVar4 = strdup(*(char **)(local_50 + 8));
      *(char **)(local_50 + 8) = pcVar4;
    }
    __gnu_cxx::
    __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::string((string *)&type_depth);
  char_index = 0;
  type_index = 0;
  arg_index = 0;
  uStack_e8 = 0;
  while( true ) {
    uVar1 = uStack_e8;
    sVar13 = type_index + 1;
    local_e9 = text[type_index];
    type_index = sVar13;
    if (local_e9 == '\0') break;
    if (local_e9 == '{') {
      if (((char_index == 0) && (text[sVar13] != '*')) && (uStack_e8 < args)) {
        bVar2 = std::
                vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ::empty(&rec->args);
        if ((bVar2) ||
           (pvVar5 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[](&rec->args,uStack_e8), *(long *)pvVar5 == 0)) {
          if ((uStack_e8 == 0) && (((byte)rec->field_0x59 >> 5 & 1) != 0)) {
            std::__cxx11::string::operator+=((string *)&type_depth,"self");
          }
          else {
            std::__cxx11::to_string
                      ((__cxx11 *)&t,uStack_e8 - (((byte)rec->field_0x59 >> 5 & 1) != 0));
            std::operator+((char *)local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "arg");
            std::__cxx11::string::operator+=((string *)&type_depth,local_110);
            std::__cxx11::string::~string(local_110);
            std::__cxx11::string::~string((string *)&t);
          }
        }
        else {
          pvVar5 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,uStack_e8);
          std::__cxx11::string::operator+=((string *)&type_depth,*(char **)pvVar5);
        }
        std::__cxx11::string::operator+=((string *)&type_depth,": ");
      }
      char_index = char_index + 1;
    }
    else if (local_e9 == '}') {
      char_index = char_index - 1;
      if (char_index == 0) {
        sVar6 = std::
                vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ::size(&rec->args);
        if ((uVar1 < sVar6) &&
           (pvVar5 = std::
                     vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ::operator[](&rec->args,uStack_e8), *(long *)(pvVar5 + 8) != 0)) {
          std::__cxx11::string::operator+=((string *)&type_depth,"=");
          pvVar5 = std::
                   vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ::operator[](&rec->args,uStack_e8);
          std::__cxx11::string::operator+=((string *)&type_depth,*(char **)(pvVar5 + 8));
        }
        uStack_e8 = uStack_e8 + 1;
      }
    }
    else if (local_e9 == '%') {
      tp = types[arg_index];
      if (tp == (type_info *)0x0) {
        arg_index = arg_index + 1;
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      arg_index = arg_index + 1;
      ptVar7 = detail::get_type_info(tp,false);
      if (ptVar7 == (type_info *)0x0) {
        pcVar4 = std::type_info::name(tp);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_160,pcVar4,&local_161);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        detail::clean_type_id((string *)local_160);
        std::__cxx11::string::operator+=((string *)&type_depth,local_160);
        std::__cxx11::string::~string(local_160);
      }
      else {
        std::__cxx11::string::operator+=((string *)&type_depth,ptVar7->type->tp_name);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)&type_depth,local_e9);
    }
  }
  if ((char_index == 0) && (types[arg_index] == (type_info *)0x0)) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    rec->signature = pcVar4;
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    shrink_to_fit(&rec->args);
    iVar3 = strcmp(rec->name,"__init__");
    local_481 = 1;
    if (iVar3 != 0) {
      iVar3 = strcmp(rec->name,"__setstate__");
      local_481 = iVar3 != 0 ^ 0xff;
    }
    rec->field_0x59 = rec->field_0x59 & 0xfe | local_481 & 1;
    rec->nargs = (uint16_t)args;
    bVar2 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar2) {
      ppPVar9 = handle::ptr(&rec->sibling);
      iVar3 = _Py_IS_TYPE(*ppPVar9,(PyTypeObject *)&PyInstanceMethod_Type);
      if (iVar3 != 0) {
        ppPVar9 = handle::ptr(&rec->sibling);
        handle::handle((handle *)&chain,(PyObject *)(*ppPVar9)[1].ob_refcnt);
        (rec->sibling).m_ptr = (PyObject *)chain;
      }
    }
    chain_start = (function_record *)0x0;
    rec_capsule.super_object.super_handle.m_ptr = (object)(object)rec;
    bVar2 = handle::operator_cast_to_bool(&rec->sibling);
    if (bVar2) {
      ppPVar9 = handle::ptr(&rec->sibling);
      iVar3 = _PyObject_TypeCheck(*ppPVar9,(PyTypeObject *)&PyCFunction_Type);
      if (iVar3 == 0) {
        bVar2 = detail::object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)&rec->sibling);
        if ((!bVar2) && (*rec->name != '_')) {
          pcVar4 = rec->name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1f0,pcVar4,
                     (allocator *)((long)&rec_capsule_1.super_object.super_handle.m_ptr + 7));
          std::operator+(local_1d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Cannot overload existing non-function object \"");
          std::operator+(local_1b0,local_1d0);
          pybind11_fail(local_1b0);
        }
      }
      else {
        ppPVar9 = handle::ptr(&rec->sibling);
        if ((*(uint *)((*ppPVar9)[1].ob_refcnt + 0x10) & 0x20) == 0) {
          ppPVar9 = handle::ptr(&rec->sibling);
          local_4b8 = (*ppPVar9)[1].ob_type;
        }
        else {
          local_4b8 = (PyTypeObject *)0x0;
        }
        handle::handle(&local_190,(PyObject *)local_4b8);
        reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_188,local_190);
        chain_start = capsule::operator_cast_to_function_record_(&local_188);
        bVar2 = detail::object_api<pybind11::handle>::is
                          ((object_api<pybind11::handle> *)&chain_start->scope,
                           (object_api<pybind11::handle> *)&rec->scope);
        if (!bVar2) {
          chain_start = (function_record *)0x0;
        }
        capsule::~capsule(&local_188);
      }
    }
    if (chain_start == (function_record *)0x0) {
      pPVar8 = (PyMethodDef *)operator_new(0x20);
      *(undefined8 *)&pPVar8->ml_flags = 0;
      pPVar8->ml_doc = (char *)0x0;
      pPVar8->ml_name = (char *)0x0;
      pPVar8->ml_meth = (PyCFunction)0x0;
      rec->def = pPVar8;
      pPVar8 = rec->def;
      *(undefined8 *)&pPVar8->ml_flags = 0;
      pPVar8->ml_doc = (char *)0x0;
      pPVar8->ml_name = (char *)0x0;
      pPVar8->ml_meth = (PyCFunction)0x0;
      rec->def->ml_name = rec->name;
      rec->def->ml_meth = dispatcher;
      rec->def->ml_flags = 3;
      destructor = initialize_generic(pybind11::detail::function_record*,char_const*,std::type_info_const*const*,unsigned_long)
                   ::{lambda(void*)#1}::operator_cast_to_function_pointer
                             ((_lambda_void___1_ *)((long)&scope_module.super_handle.m_ptr + 7));
      capsule::capsule((capsule *)&local_200,rec,destructor);
      object::object((object *)&local_210);
      bVar2 = handle::operator_cast_to_bool(&rec->scope);
      if (bVar2) {
        local_218 = (rec->scope).m_ptr;
        bVar2 = hasattr((handle)local_218,"__module__");
        if (bVar2) {
          detail::object_api<pybind11::handle>::attr
                    (&local_240,(object_api<pybind11::handle> *)&rec->scope,"__module__");
          detail::accessor::operator_cast_to_object((accessor *)&local_220);
          object::operator=((object *)&local_210,&local_220);
          object::~object(&local_220);
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_240);
        }
        else {
          local_248 = (rec->scope).m_ptr;
          bVar2 = hasattr((handle)local_248,"__name__");
          if (bVar2) {
            detail::object_api<pybind11::handle>::attr
                      (&local_270,(object_api<pybind11::handle> *)&rec->scope,"__name__");
            detail::accessor::operator_cast_to_object((accessor *)&local_250);
            object::operator=((object *)&local_210,&local_250);
            object::~object(&local_250);
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_270);
          }
        }
      }
      pPVar8 = rec->def;
      ppPVar9 = handle::ptr(&local_200);
      pPVar10 = *ppPVar9;
      ppPVar9 = handle::ptr(&local_210);
      pPVar10 = (PyObject *)PyCMethod_New(pPVar8,pPVar10,*ppPVar9,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar10;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      object::~object((object *)&local_210);
      capsule::~capsule((capsule *)&local_200);
    }
    else {
      ppPVar9 = handle::ptr(&rec->sibling);
      (this->super_function).super_object.super_handle.m_ptr = *ppPVar9;
      handle::inc_ref((handle *)this);
      rec_capsule.super_object.super_handle.m_ptr = (object)(object)chain_start;
      if (((byte)chain_start->field_0x59 >> 5 & 1) != ((byte)rec->field_0x59 >> 5 & 1)) {
        pcVar4 = "static";
        if (((byte)rec->field_0x59 >> 5 & 1) != 0) {
          pcVar4 = "instance";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,pcVar4,&local_351);
        std::operator+(local_330,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                      );
        std::operator+(local_310,local_330);
        detail::object_api<pybind11::handle>::attr
                  (&local_3a8,(object_api<pybind11::handle> *)&rec->scope,"__name__");
        detail::accessor::operator_cast_to_object((accessor *)&local_388);
        str::str(&local_380,&local_388);
        str::operator_cast_to_string(local_378);
        std::operator+(local_2f0,local_310);
        std::operator+(local_2d0,(char *)local_2f0);
        pcVar4 = rec->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,pcVar4,&local_3c9);
        std::operator+(local_2b0,local_2d0);
        std::operator+(local_290,local_2b0);
        pybind11_fail(local_290);
      }
      for (; chain_start->next != (function_record *)0x0; chain_start = chain_start->next) {
      }
      chain_start->next = rec;
    }
    std::__cxx11::string::string(local_3f0);
    it._4_4_ = 0;
    if ((chain_start != (function_record *)0x0) &&
       (bVar2 = options::show_function_signatures(), bVar2)) {
      std::__cxx11::string::operator+=(local_3f0,rec->name);
      std::__cxx11::string::operator+=(local_3f0,"(*args, **kwargs)\n");
      std::__cxx11::string::operator+=(local_3f0,"Overloaded function.\n\n");
    }
    it._3_1_ = 1;
    for (local_400.m_ptr = (PyObject *)rec_capsule.super_object.super_handle.m_ptr;
        local_400.m_ptr != (PyObject *)0x0; local_400.m_ptr = (PyObject *)local_400.m_ptr[7].ob_type
        ) {
      bVar2 = options::show_function_signatures();
      if (bVar2) {
        if (0 < it._4_4_) {
          std::__cxx11::string::operator+=(local_3f0,"\n");
        }
        if (chain_start != (function_record *)0x0) {
          it._4_4_ = it._4_4_ + 1;
          std::__cxx11::to_string((__cxx11 *)&func,it._4_4_);
          std::operator+(local_420,(char *)&func);
          std::__cxx11::string::operator+=(local_3f0,(string *)local_420);
          std::__cxx11::string::~string((string *)local_420);
          std::__cxx11::string::~string((string *)&func);
        }
        std::__cxx11::string::operator+=(local_3f0,rec->name);
        std::__cxx11::string::operator+=(local_3f0,(char *)local_400.m_ptr[1].ob_refcnt);
        std::__cxx11::string::operator+=(local_3f0,"\n");
      }
      if ((((local_400.m_ptr)->ob_type != (PyTypeObject *)0x0) &&
          (sVar11 = strlen((char *)(local_400.m_ptr)->ob_type), sVar11 != 0)) &&
         (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
        bVar2 = options::show_function_signatures();
        if (!bVar2) {
          if ((it._3_1_ & 1) == 0) {
            std::__cxx11::string::operator+=(local_3f0,"\n");
          }
          else {
            it._3_1_ = 0;
          }
        }
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_3f0,"\n");
        }
        std::__cxx11::string::operator+=(local_3f0,(char *)(local_400.m_ptr)->ob_type);
        bVar2 = options::show_function_signatures();
        if (bVar2) {
          std::__cxx11::string::operator+=(local_3f0,"\n");
        }
      }
    }
    pPVar10 = (this->super_function).super_object.super_handle.m_ptr;
    if (*(long *)(pPVar10[1].ob_refcnt + 0x18) != 0) {
      free(*(void **)(pPVar10[1].ob_refcnt + 0x18));
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    *(char **)(pPVar10[1].ob_refcnt + 0x18) = pcVar4;
    if (((byte)rec->field_0x59 >> 5 & 1) != 0) {
      pPVar12 = (PyObject *)
                PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
      (this->super_function).super_object.super_handle.m_ptr = pPVar12;
      if ((this->super_function).super_object.super_handle.m_ptr == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
      }
      _Py_DECREF(pPVar10);
    }
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string((string *)&type_depth);
    return;
  }
  pybind11_fail("Internal error while parsing type signature (2)");
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty() && rec->args[arg_index].name) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CONSTEXPR_DESCR)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }